

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O1

QMenu * __thiscall QLineEdit::createStandardContextMenu(QLineEdit *this)

{
  long lVar1;
  void **ppvVar2;
  int *piVar3;
  byte bVar4;
  char cVar5;
  bool bVar6;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_00;
  QAction *pQVar7;
  undefined4 *puVar8;
  undefined8 uVar9;
  QUnicodeControlCharacterMenu *this_01;
  QKeySequence *pQVar10;
  long in_FS_OFFSET;
  QAnyStringView QVar11;
  QObject local_328 [8];
  QKeySequence local_320 [8];
  QArrayData *local_318;
  char16_t *pcStack_310;
  qsizetype local_308;
  QStringBuilder<char16_t,_QString> local_2f8;
  QKeySequence local_2d0 [8];
  QString local_2c8;
  QArrayData *local_2a8;
  char16_t *pcStack_2a0;
  long local_298;
  QString local_288;
  QObject local_270 [8];
  QObject local_268 [8];
  QKeySequence local_260 [8];
  QArrayData *local_258;
  char16_t *pcStack_250;
  qsizetype local_248;
  QStringBuilder<char16_t,_QString> local_238;
  QKeySequence local_210 [8];
  QString local_208;
  QObject local_1e8 [8];
  QKeySequence local_1e0 [8];
  QArrayData *local_1d8;
  char16_t *pcStack_1d0;
  qsizetype local_1c8;
  QStringBuilder<char16_t,_QString> local_1b8;
  QKeySequence local_190 [8];
  QString local_188;
  QObject local_168 [8];
  QKeySequence local_160 [8];
  QArrayData *local_158;
  char16_t *pcStack_150;
  qsizetype local_148;
  QStringBuilder<char16_t,_QString> local_138;
  QKeySequence local_110 [8];
  QObject local_108 [8];
  QKeySequence local_100 [8];
  QArrayData *local_f8;
  char16_t *pcStack_f0;
  qsizetype local_e8;
  QStringBuilder<char16_t,_QString> local_e0;
  QKeySequence local_c0 [8];
  QObject local_b8 [8];
  QKeySequence local_b0 [8];
  QArrayData *local_a8;
  char16_t *pcStack_a0;
  qsizetype local_98;
  QStringBuilder<char16_t,_QString> local_90;
  QKeySequence local_70 [8];
  QStringBuilder<QString,_QString> local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  this_00.m_data = operator_new(0x28);
  QMenu::QMenu((QMenu *)this_00.m_data,&this->super_QWidget);
  QVar11.m_size = (size_t)"qt_edit_menu";
  QVar11.field_0.m_data = this_00.m_data;
  QObject::setObjectName(QVar11);
  if ((*(byte *)(*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600) + 0x50) & 4) == 0) {
    QMetaObject::tr((char *)&local_138,(char *)&staticMetaObject,0x6e7144);
    bVar4 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    if (bVar4 == 0) {
      pQVar10 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
      QKeySequence::QKeySequence(local_70,Undo);
      cVar5 = QShortcutMap::hasShortcutForKeySequence(pQVar10);
      if (cVar5 != '\0') goto LAB_0042329f;
      QKeySequence::QKeySequence(local_b0,Undo);
      QKeySequence::toString((SequenceFormat)&local_a8);
      local_90.b.d.size = local_98;
      local_90.b.d.ptr = pcStack_a0;
      local_90.b.d.d = (Data *)local_a8;
      local_90.a = L'\t';
      local_a8 = (QArrayData *)0x0;
      pcStack_a0 = (char16_t *)0x0;
      local_98 = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>((QString *)&local_1b8,&local_90);
      bVar6 = true;
      bVar4 = 1;
    }
    else {
LAB_0042329f:
      bVar4 = bVar4 ^ 1;
      local_1b8._0_8_ = (QArrayData *)0x0;
      local_1b8.b.d.d = (Data *)0x0;
      local_1b8.b.d.ptr = (char16_t *)0x0;
      bVar6 = false;
    }
    local_68.a.d.size = (qsizetype)local_138.b.d.ptr;
    local_68.a.d.ptr = (char16_t *)local_138.b.d.d;
    local_68.a.d.d = (Data *)local_138._0_8_;
    local_68.b.d.size = (qsizetype)local_1b8.b.d.ptr;
    local_68.b.d.ptr = (char16_t *)local_1b8.b.d.d;
    local_68.b.d.d = (Data *)local_1b8._0_8_;
    local_138._0_8_ = (QArrayData *)0x0;
    local_138.b.d.d = (Data *)0x0;
    local_138.b.d.ptr = (char16_t *)0x0;
    local_1b8._0_8_ = (QArrayData *)0x0;
    local_1b8.b.d.d = (Data *)0x0;
    local_1b8.b.d.ptr = (char16_t *)0x0;
    QStringBuilder<QString,_QString>::convertTo<QString>((QString *)&local_e0,&local_68);
    pQVar7 = QWidget::addAction((QWidget *)this_00.m_data,(QString *)&local_e0);
    if ((QArrayData *)local_e0._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_e0._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_e0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_e0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_e0._0_8_,2,0x10);
      }
    }
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_68);
    if ((QArrayData *)local_1b8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_1b8._0_8_,2,0x10);
      }
    }
    if (bVar6) {
      if (&(local_90.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_90.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_90.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_90.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_90.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_a8 != (QArrayData *)0x0) {
        LOCK();
        (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_a8,2,0x10);
        }
      }
      QKeySequence::~QKeySequence(local_b0);
    }
    if (bVar4 != 0) {
      QKeySequence::~QKeySequence(local_70);
    }
    if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_138._0_8_,2,0x10);
      }
    }
    QWidgetLineControl::isUndoAvailable(*(QWidgetLineControl **)(lVar1 + 600));
    QAction::setEnabled(SUB81(pQVar7,0));
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-undo";
    local_68.a.d.size = 9;
    QObject::doSetObjectName((QString *)pQVar7);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-undo";
    local_68.a.d.size = 9;
    setActionIcon(pQVar7,&local_68.a);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_e0._0_8_ = undo;
    local_e0.b.d.d = (Data *)0x0;
    local_68.a.d.d = (Data *)QAction::triggered;
    local_68.a.d.ptr = (char16_t *)0x0;
    puVar8 = (undefined4 *)operator_new(0x20);
    *puVar8 = 1;
    *(code **)(puVar8 + 2) =
         QtPrivate::QCallableObject<void_(QLineEdit::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar8 + 4) = undo;
    *(undefined8 *)(puVar8 + 6) = 0;
    QObject::connectImpl
              (local_b8,(void **)pQVar7,(QObject *)&local_68,(void **)this,
               (QSlotObjectBase *)&local_e0,(ConnectionType)puVar8,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_b8);
    QMetaObject::tr((char *)&local_1b8,(char *)&staticMetaObject,0x6e714a);
    bVar4 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    if (bVar4 == 0) {
      pQVar10 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
      QKeySequence::QKeySequence(local_c0,Redo);
      cVar5 = QShortcutMap::hasShortcutForKeySequence(pQVar10);
      if (cVar5 != '\0') goto LAB_0042364c;
      QKeySequence::QKeySequence(local_100,Redo);
      QKeySequence::toString((SequenceFormat)&local_f8);
      local_e0.b.d.size = local_e8;
      local_e0.b.d.ptr = pcStack_f0;
      local_e0.b.d.d = (Data *)local_f8;
      local_e0.a = 9;
      local_f8 = (QArrayData *)0x0;
      pcStack_f0 = (char16_t *)0x0;
      local_e8 = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>((QString *)&local_238,&local_e0);
      bVar6 = true;
      bVar4 = 1;
    }
    else {
LAB_0042364c:
      bVar4 = bVar4 ^ 1;
      local_238._0_8_ = (QArrayData *)0x0;
      local_238.b.d.d = (Data *)0x0;
      local_238.b.d.ptr = (char16_t *)0x0;
      bVar6 = false;
    }
    local_68.a.d.size = (qsizetype)local_1b8.b.d.ptr;
    local_68.a.d.ptr = (char16_t *)local_1b8.b.d.d;
    local_68.a.d.d = (Data *)local_1b8._0_8_;
    local_68.b.d.size = (qsizetype)local_238.b.d.ptr;
    local_68.b.d.ptr = (char16_t *)local_238.b.d.d;
    local_68.b.d.d = (Data *)local_238._0_8_;
    local_1b8._0_8_ = (QArrayData *)0x0;
    local_1b8.b.d.d = (Data *)0x0;
    local_1b8.b.d.ptr = (char16_t *)0x0;
    local_238._0_8_ = (QArrayData *)0x0;
    local_238.b.d.d = (Data *)0x0;
    local_238.b.d.ptr = (char16_t *)0x0;
    QStringBuilder<QString,_QString>::convertTo<QString>((QString *)&local_138,&local_68);
    pQVar7 = QWidget::addAction((QWidget *)this_00.m_data,(QString *)&local_138);
    if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_138._0_8_,2,0x10);
      }
    }
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_68);
    if ((QArrayData *)local_238._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
      }
    }
    if (bVar6) {
      if (&(local_e0.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e0.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e0.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_e0.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_e0.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_f8 != (QArrayData *)0x0) {
        LOCK();
        (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_f8,2,0x10);
        }
      }
      QKeySequence::~QKeySequence(local_100);
    }
    if (bVar4 != 0) {
      QKeySequence::~QKeySequence(local_c0);
    }
    if ((QArrayData *)local_1b8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_1b8._0_8_,2,0x10);
      }
    }
    QWidgetLineControl::isRedoAvailable(*(QWidgetLineControl **)(lVar1 + 600));
    QAction::setEnabled(SUB81(pQVar7,0));
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-redo";
    local_68.a.d.size = 9;
    QObject::doSetObjectName((QString *)pQVar7);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-redo";
    local_68.a.d.size = 9;
    setActionIcon(pQVar7,&local_68.a);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_138._0_8_ = redo;
    local_138.b.d.d = (Data *)0x0;
    local_68.a.d.d = (Data *)QAction::triggered;
    local_68.a.d.ptr = (char16_t *)0x0;
    puVar8 = (undefined4 *)operator_new(0x20);
    *puVar8 = 1;
    *(code **)(puVar8 + 2) =
         QtPrivate::QCallableObject<void_(QLineEdit::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar8 + 4) = redo;
    *(undefined8 *)(puVar8 + 6) = 0;
    QObject::connectImpl
              (local_108,(void **)pQVar7,(QObject *)&local_68,(void **)this,
               (QSlotObjectBase *)&local_138,(ConnectionType)puVar8,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_108);
    QMenu::addSeparator((QMenu *)this_00.m_data);
  }
  if ((*(byte *)(*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600) + 0x50) & 4) == 0) {
    QMetaObject::tr((char *)&local_238,(char *)&staticMetaObject,0x6e7150);
    bVar4 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    if (bVar4 == 0) {
      pQVar10 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
      QKeySequence::QKeySequence(local_110,Cut);
      cVar5 = QShortcutMap::hasShortcutForKeySequence(pQVar10);
      if (cVar5 != '\0') goto LAB_00423a2d;
      QKeySequence::QKeySequence(local_160,Cut);
      QKeySequence::toString((SequenceFormat)&local_158);
      local_138.b.d.size = local_148;
      local_138.b.d.ptr = pcStack_150;
      local_138.b.d.d = (Data *)local_158;
      local_138.a = 9;
      local_158 = (QArrayData *)0x0;
      pcStack_150 = (char16_t *)0x0;
      local_148 = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>((QString *)&local_2f8,&local_138);
      bVar4 = 1;
      bVar6 = true;
    }
    else {
LAB_00423a2d:
      bVar4 = bVar4 ^ 1;
      local_2f8._0_8_ = (QArrayData *)0x0;
      local_2f8.b.d.d = (Data *)0x0;
      local_2f8.b.d.ptr = (char16_t *)0x0;
      bVar6 = false;
    }
    local_68.a.d.size = (qsizetype)local_238.b.d.ptr;
    local_68.a.d.ptr = (char16_t *)local_238.b.d.d;
    local_68.a.d.d = (Data *)local_238._0_8_;
    local_68.b.d.size = (qsizetype)local_2f8.b.d.ptr;
    local_68.b.d.ptr = (char16_t *)local_2f8.b.d.d;
    local_68.b.d.d = (Data *)local_2f8._0_8_;
    local_238._0_8_ = (QArrayData *)0x0;
    local_238.b.d.d = (Data *)0x0;
    local_238.b.d.ptr = (char16_t *)0x0;
    local_2f8._0_8_ = (QArrayData *)0x0;
    local_2f8.b.d.d = (Data *)0x0;
    local_2f8.b.d.ptr = (char16_t *)0x0;
    QStringBuilder<QString,_QString>::convertTo<QString>((QString *)&local_1b8,&local_68);
    pQVar7 = QWidget::addAction((QWidget *)this_00.m_data,(QString *)&local_1b8);
    if ((QArrayData *)local_1b8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_1b8._0_8_,2,0x10);
      }
    }
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_68);
    if ((QArrayData *)local_2f8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_2f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_2f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_2f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_2f8._0_8_,2,0x10);
      }
    }
    if (bVar6) {
      if (&(local_138.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_138.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_138.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_138.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate(&(local_138.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_158 != (QArrayData *)0x0) {
        LOCK();
        (local_158->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_158->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_158->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_158,2,0x10);
        }
      }
      QKeySequence::~QKeySequence(local_160);
    }
    if (bVar4 != 0) {
      QKeySequence::~QKeySequence(local_110);
    }
    if ((QArrayData *)local_238._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
      }
    }
    QAction::setEnabled(SUB81(pQVar7,0));
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-cut";
    local_68.a.d.size = 8;
    QObject::doSetObjectName((QString *)pQVar7);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-cut";
    local_68.a.d.size = 8;
    setActionIcon(pQVar7,&local_68.a);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_1b8._0_8_ = cut;
    local_1b8.b.d.d = (Data *)0x0;
    local_68.a.d.d = (Data *)QAction::triggered;
    local_68.a.d.ptr = (char16_t *)0x0;
    puVar8 = (undefined4 *)operator_new(0x20);
    *puVar8 = 1;
    *(code **)(puVar8 + 2) =
         QtPrivate::QCallableObject<void_(QLineEdit::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar8 + 4) = cut;
    *(undefined8 *)(puVar8 + 6) = 0;
    QObject::connectImpl
              (local_168,(void **)pQVar7,(QObject *)&local_68,(void **)this,
               (QSlotObjectBase *)&local_1b8,(ConnectionType)puVar8,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_168);
  }
  QMetaObject::tr((char *)&local_2f8,(char *)&staticMetaObject,0x6e7155);
  bVar4 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
  if (bVar4 == 0) {
    pQVar10 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
    QKeySequence::QKeySequence(local_190,Copy);
    cVar5 = QShortcutMap::hasShortcutForKeySequence(pQVar10);
    if (cVar5 != '\0') goto LAB_00423dec;
    QKeySequence::QKeySequence(local_1e0,Copy);
    QKeySequence::toString((SequenceFormat)&local_1d8);
    local_1b8.b.d.size = local_1c8;
    local_1b8.b.d.ptr = pcStack_1d0;
    local_1b8.b.d.d = (Data *)local_1d8;
    local_1b8.a = 9;
    local_1d8 = (QArrayData *)0x0;
    pcStack_1d0 = (char16_t *)0x0;
    local_1c8 = 0;
    QStringBuilder<char16_t,_QString>::convertTo<QString>(&local_188,&local_1b8);
    bVar4 = 1;
    bVar6 = true;
  }
  else {
LAB_00423dec:
    bVar4 = bVar4 ^ 1;
    local_188.d.d = (Data *)0x0;
    local_188.d.ptr = (char16_t *)0x0;
    local_188.d.size = 0;
    bVar6 = false;
  }
  local_68.b.d.size = local_188.d.size;
  local_68.b.d.ptr = local_188.d.ptr;
  local_68.b.d.d = local_188.d.d;
  local_68.a.d.size = (qsizetype)local_2f8.b.d.ptr;
  local_68.a.d.ptr = (char16_t *)local_2f8.b.d.d;
  local_68.a.d.d = (Data *)local_2f8._0_8_;
  local_2f8._0_8_ = (QArrayData *)0x0;
  local_2f8.b.d.d = (Data *)0x0;
  local_2f8.b.d.ptr = (char16_t *)0x0;
  local_188.d.d = (Data *)0x0;
  local_188.d.ptr = (char16_t *)0x0;
  local_188.d.size = 0;
  QStringBuilder<QString,_QString>::convertTo<QString>((QString *)&local_238,&local_68);
  pQVar7 = QWidget::addAction((QWidget *)this_00.m_data,(QString *)&local_238);
  if ((QArrayData *)local_238._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
    }
  }
  QStringBuilder<QString,_QString>::~QStringBuilder(&local_68);
  if (&(local_188.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar6) {
    if (&(local_1b8.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1b8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1b8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1b8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1b8.b.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_1d8 != (QArrayData *)0x0) {
      LOCK();
      (local_1d8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_1d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_1d8,2,0x10);
      }
    }
    QKeySequence::~QKeySequence(local_1e0);
  }
  if (bVar4 != 0) {
    QKeySequence::~QKeySequence(local_190);
  }
  if ((QArrayData *)local_2f8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_2f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_2f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_2f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_2f8._0_8_,2,0x10);
    }
  }
  QAction::setEnabled(SUB81(pQVar7,0));
  local_68.a.d.d = (Data *)0x0;
  local_68.a.d.ptr = L"edit-copy";
  local_68.a.d.size = 9;
  QObject::doSetObjectName((QString *)pQVar7);
  if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_68.a.d.d = (Data *)0x0;
  local_68.a.d.ptr = L"edit-copy";
  local_68.a.d.size = 9;
  setActionIcon(pQVar7,&local_68.a);
  if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_238._0_8_ = copy;
  local_238.b.d.d = (Data *)0x0;
  local_68.a.d.d = (Data *)QAction::triggered;
  local_68.a.d.ptr = (char16_t *)0x0;
  puVar8 = (undefined4 *)operator_new(0x20);
  *puVar8 = 1;
  *(code **)(puVar8 + 2) =
       QtPrivate::QCallableObject<void_(QLineEdit::*)()_const,_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar8 + 4) = copy;
  *(undefined8 *)(puVar8 + 6) = 0;
  QObject::connectImpl
            (local_1e8,(void **)pQVar7,(QObject *)&local_68,(void **)this,
             (QSlotObjectBase *)&local_238,(ConnectionType)puVar8,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_1e8);
  if ((*(byte *)(*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600) + 0x50) & 4) == 0) {
    QMetaObject::tr((char *)&local_188,(char *)&staticMetaObject,0x6e715b);
    bVar4 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    if (bVar4 == 0) {
      pQVar10 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
      QKeySequence::QKeySequence(local_210,Paste);
      cVar5 = QShortcutMap::hasShortcutForKeySequence(pQVar10);
      if (cVar5 != '\0') goto LAB_004241bf;
      QKeySequence::QKeySequence(local_260,Paste);
      QKeySequence::toString((SequenceFormat)&local_258);
      local_238.b.d.size = local_248;
      local_238.b.d.ptr = pcStack_250;
      local_238.b.d.d = (Data *)local_258;
      local_238.a = 9;
      local_258 = (QArrayData *)0x0;
      pcStack_250 = (char16_t *)0x0;
      local_248 = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>(&local_208,&local_238);
      bVar4 = 1;
      bVar6 = true;
    }
    else {
LAB_004241bf:
      bVar4 = bVar4 ^ 1;
      local_208.d.d = (Data *)0x0;
      local_208.d.ptr = (char16_t *)0x0;
      local_208.d.size = 0;
      bVar6 = false;
    }
    local_68.a.d.size = local_188.d.size;
    local_68.a.d.ptr = local_188.d.ptr;
    local_68.a.d.d = local_188.d.d;
    local_68.b.d.size = local_208.d.size;
    local_68.b.d.ptr = local_208.d.ptr;
    local_68.b.d.d = local_208.d.d;
    local_188.d.d = (Data *)0x0;
    local_188.d.ptr = (char16_t *)0x0;
    local_188.d.size = 0;
    local_208.d.d = (Data *)0x0;
    local_208.d.ptr = (char16_t *)0x0;
    local_208.d.size = 0;
    QStringBuilder<QString,_QString>::convertTo<QString>((QString *)&local_2f8,&local_68);
    pQVar7 = QWidget::addAction((QWidget *)this_00.m_data,(QString *)&local_2f8);
    if ((QArrayData *)local_2f8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_2f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_2f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_2f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_2f8._0_8_,2,0x10);
      }
    }
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_68);
    if (&(local_208.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_208.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (bVar6) {
      if (&(local_238.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_238.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_238.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_238.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate(&(local_238.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_258 != (QArrayData *)0x0) {
        LOCK();
        (local_258->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_258->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_258->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_258,2,0x10);
        }
      }
      QKeySequence::~QKeySequence(local_260);
    }
    if (bVar4 != 0) {
      QKeySequence::~QKeySequence(local_210);
    }
    if (&(local_188.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((*(ushort *)(*(long *)(lVar1 + 600) + 0x50) & 4) == 0) {
      QGuiApplication::clipboard();
      QClipboard::text((Mode)&local_188);
      QAction::setEnabled(SUB81(pQVar7,0));
      if (&(local_188.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      QAction::setEnabled(SUB81(pQVar7,0));
    }
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-paste";
    local_68.a.d.size = 10;
    QObject::doSetObjectName((QString *)pQVar7);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-paste";
    local_68.a.d.size = 10;
    setActionIcon(pQVar7,&local_68.a);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_2f8._0_8_ = paste;
    local_2f8.b.d.d = (Data *)0x0;
    local_68.a.d.d = (Data *)QAction::triggered;
    local_68.a.d.ptr = (char16_t *)0x0;
    puVar8 = (undefined4 *)operator_new(0x20);
    *puVar8 = 1;
    *(code **)(puVar8 + 2) =
         QtPrivate::QCallableObject<void_(QLineEdit::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar8 + 4) = paste;
    *(undefined8 *)(puVar8 + 6) = 0;
    QObject::connectImpl
              (local_268,(void **)pQVar7,(QObject *)&local_68,(void **)this,
               (QSlotObjectBase *)&local_2f8,(ConnectionType)puVar8,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_268);
  }
  if ((*(byte *)(*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600) + 0x50) & 4) == 0) {
    QMetaObject::tr((char *)&local_68,(char *)&staticMetaObject,0x6f4a10);
    pQVar7 = QWidget::addAction((QWidget *)this_00.m_data,&local_68.a);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((*(ushort *)(*(QWidgetLineControl **)(lVar1 + 600) + 0x50) & 4) == 0) {
      QWidgetLineControl::text(&local_208,*(QWidgetLineControl **)(lVar1 + 600));
      QAction::setEnabled(SUB81(pQVar7,0));
      if (&(local_208.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_208.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      QAction::setEnabled(SUB81(pQVar7,0));
    }
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-delete";
    local_68.a.d.size = 0xb;
    QObject::doSetObjectName((QString *)pQVar7);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-delete";
    local_68.a.d.size = 0xb;
    setActionIcon(pQVar7,&local_68.a);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    ppvVar2 = *(void ***)(lVar1 + 600);
    local_2f8._0_8_ = QWidgetLineControl::_q_deleteSelected;
    local_2f8.b.d.d = (Data *)0x0;
    local_68.a.d.d = (Data *)QAction::triggered;
    local_68.a.d.ptr = (char16_t *)0x0;
    puVar8 = (undefined4 *)operator_new(0x20);
    *puVar8 = 1;
    *(code **)(puVar8 + 2) =
         QtPrivate::QCallableObject<void_(QWidgetLineControl::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar8 + 4) = QWidgetLineControl::_q_deleteSelected;
    *(undefined8 *)(puVar8 + 6) = 0;
    QObject::connectImpl
              (local_270,(void **)pQVar7,(QObject *)&local_68,ppvVar2,(QSlotObjectBase *)&local_2f8,
               (ConnectionType)puVar8,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_270);
  }
  bVar6 = QMenu::isEmpty((QMenu *)this_00.m_data);
  if (!bVar6) {
    QMenu::addSeparator((QMenu *)this_00.m_data);
  }
  QMetaObject::tr((char *)&local_2a8,(char *)&staticMetaObject,0x6ec566);
  bVar4 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
  if (bVar4 == 0) {
    pQVar10 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
    QKeySequence::QKeySequence(local_2d0,SelectAll);
    cVar5 = QShortcutMap::hasShortcutForKeySequence(pQVar10);
    if (cVar5 == '\0') {
      QKeySequence::QKeySequence(local_320,SelectAll);
      QKeySequence::toString((SequenceFormat)&local_318);
      local_2f8.b.d.size = local_308;
      local_2f8.b.d.ptr = pcStack_310;
      local_2f8.b.d.d = (Data *)local_318;
      local_2f8.a = 9;
      local_318 = (QArrayData *)0x0;
      pcStack_310 = (char16_t *)0x0;
      local_308 = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>(&local_2c8,&local_2f8);
      bVar4 = 1;
      bVar6 = true;
      goto LAB_0042489d;
    }
  }
  bVar4 = bVar4 ^ 1;
  local_2c8.d.d = (Data *)0x0;
  local_2c8.d.ptr = (char16_t *)0x0;
  local_2c8.d.size = 0;
  bVar6 = false;
LAB_0042489d:
  local_68.a.d.size = local_298;
  local_68.a.d.ptr = pcStack_2a0;
  local_68.a.d.d = (Data *)local_2a8;
  local_68.b.d.size = local_2c8.d.size;
  local_68.b.d.ptr = local_2c8.d.ptr;
  local_68.b.d.d = local_2c8.d.d;
  local_2a8 = (QArrayData *)0x0;
  pcStack_2a0 = (char16_t *)0x0;
  local_298 = 0;
  local_2c8.d.d = (Data *)0x0;
  local_2c8.d.ptr = (char16_t *)0x0;
  local_2c8.d.size = 0;
  QStringBuilder<QString,_QString>::convertTo<QString>(&local_288,&local_68);
  pQVar7 = QWidget::addAction((QWidget *)this_00.m_data,&local_288);
  if (&(local_288.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_288.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_288.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_288.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_288.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStringBuilder<QString,_QString>::~QStringBuilder(&local_68);
  if (&(local_2c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_2c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_2c8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar6) {
    if (&(local_2f8.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_2f8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2f8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_2f8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_2f8.b.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_318 != (QArrayData *)0x0) {
      LOCK();
      (local_318->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_318->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_318->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_318,2,0x10);
      }
    }
    QKeySequence::~QKeySequence(local_320);
  }
  if (bVar4 != 0) {
    QKeySequence::~QKeySequence(local_2d0);
  }
  if (local_2a8 != (QArrayData *)0x0) {
    LOCK();
    (local_2a8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_2a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_2a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_2a8,2,0x10);
    }
  }
  QWidgetLineControl::text(&local_68.a,*(QWidgetLineControl **)(lVar1 + 600));
  QAction::setEnabled(SUB81(pQVar7,0));
  if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_68.a.d.d = (Data *)0x0;
  local_68.a.d.ptr = L"select-all";
  local_68.a.d.size = 10;
  QObject::doSetObjectName((QString *)pQVar7);
  if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_68.a.d.d = (Data *)0x0;
  local_68.a.d.ptr = L"edit-select-all";
  local_68.a.d.size = 0xf;
  setActionIcon(pQVar7,&local_68.a);
  if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  uVar9 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)pQVar7);
  piVar3 = *(int **)(lVar1 + 0x260);
  *(undefined8 *)(lVar1 + 0x260) = uVar9;
  *(QAction **)(lVar1 + 0x268) = pQVar7;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      operator_delete(piVar3);
    }
  }
  local_288.d.d = (Data *)selectAll;
  local_288.d.ptr = (char16_t *)0x0;
  local_68.a.d.d = (Data *)QAction::triggered;
  local_68.a.d.ptr = (char16_t *)0x0;
  puVar8 = (undefined4 *)operator_new(0x20);
  *puVar8 = 1;
  *(code **)(puVar8 + 2) =
       QtPrivate::QCallableObject<void_(QLineEdit::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar8 + 4) = selectAll;
  *(undefined8 *)(puVar8 + 6) = 0;
  QObject::connectImpl
            (local_328,(void **)pQVar7,(QObject *)&local_68,(void **)this,
             (QSlotObjectBase *)&local_288,(ConnectionType)puVar8,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_328);
  if ((*(byte *)(*(long *)(lVar1 + 600) + 0x50) & 4) == 0) {
    QGuiApplication::styleHints();
    cVar5 = QStyleHints::useRtlExtensions();
    if (cVar5 != '\0') {
      QMenu::addSeparator((QMenu *)this_00.m_data);
      this_01 = (QUnicodeControlCharacterMenu *)operator_new(0x30);
      QUnicodeControlCharacterMenu::QUnicodeControlCharacterMenu
                (this_01,(QObject *)this,(QWidget *)this_00.m_data);
      QMenu::addMenu((QMenu *)this_00.m_data,(QMenu *)this_01);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QMenu *)this_00.m_data;
  }
  __stack_chk_fail();
}

Assistant:

QMenu *QLineEdit::createStandardContextMenu()
{
    Q_D(QLineEdit);
    QMenu *popup = new QMenu(this);
    popup->setObjectName("qt_edit_menu"_L1);
    QAction *action = nullptr;

    if (!isReadOnly()) {
        action = popup->addAction(QLineEdit::tr("&Undo") + ACCEL_KEY(QKeySequence::Undo));
        action->setEnabled(d->control->isUndoAvailable());
        action->setObjectName(QStringLiteral("edit-undo"));
        setActionIcon(action, QStringLiteral("edit-undo"));
        connect(action, &QAction::triggered, this, &QLineEdit::undo);

        action = popup->addAction(QLineEdit::tr("&Redo") + ACCEL_KEY(QKeySequence::Redo));
        action->setEnabled(d->control->isRedoAvailable());
        action->setObjectName(QStringLiteral("edit-redo"));
        setActionIcon(action, QStringLiteral("edit-redo"));
        connect(action, &QAction::triggered, this, &QLineEdit::redo);

        popup->addSeparator();
    }

#ifndef QT_NO_CLIPBOARD
    if (!isReadOnly()) {
        action = popup->addAction(QLineEdit::tr("Cu&t") + ACCEL_KEY(QKeySequence::Cut));
        action->setEnabled(!d->control->isReadOnly() && d->control->hasSelectedText()
                && d->control->echoMode() == QLineEdit::Normal);
        action->setObjectName(QStringLiteral("edit-cut"));
        setActionIcon(action, QStringLiteral("edit-cut"));
        connect(action, &QAction::triggered, this, &QLineEdit::cut);
    }

    action = popup->addAction(QLineEdit::tr("&Copy") + ACCEL_KEY(QKeySequence::Copy));
    action->setEnabled(d->control->hasSelectedText()
            && d->control->echoMode() == QLineEdit::Normal);
    action->setObjectName(QStringLiteral("edit-copy"));
    setActionIcon(action, QStringLiteral("edit-copy"));
    connect(action, &QAction::triggered, this, &QLineEdit::copy);

    if (!isReadOnly()) {
        action = popup->addAction(QLineEdit::tr("&Paste") + ACCEL_KEY(QKeySequence::Paste));
        action->setEnabled(!d->control->isReadOnly() && !QGuiApplication::clipboard()->text().isEmpty());
        action->setObjectName(QStringLiteral("edit-paste"));
        setActionIcon(action, QStringLiteral("edit-paste"));
        connect(action, &QAction::triggered, this, &QLineEdit::paste);
    }
#endif

    if (!isReadOnly()) {
        action = popup->addAction(QLineEdit::tr("Delete"));
        action->setEnabled(!d->control->isReadOnly() && !d->control->text().isEmpty() && d->control->hasSelectedText());
        action->setObjectName(QStringLiteral("edit-delete"));
        setActionIcon(action, QStringLiteral("edit-delete"));
        connect(action, &QAction::triggered,
                d->control, &QWidgetLineControl::_q_deleteSelected);
    }

    if (!popup->isEmpty())
        popup->addSeparator();

    action = popup->addAction(QLineEdit::tr("Select All") + ACCEL_KEY(QKeySequence::SelectAll));
    action->setEnabled(!d->control->text().isEmpty() && !d->control->allSelected());
    action->setObjectName(QStringLiteral("select-all"));
    setActionIcon(action, QStringLiteral("edit-select-all"));
    d->selectAllAction = action;
    connect(action, &QAction::triggered, this, &QLineEdit::selectAll);

    if (!d->control->isReadOnly() && QGuiApplication::styleHints()->useRtlExtensions()) {
        popup->addSeparator();
        QUnicodeControlCharacterMenu *ctrlCharacterMenu = new QUnicodeControlCharacterMenu(this, popup);
        popup->addMenu(ctrlCharacterMenu);
    }
    return popup;
}